

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

void __thiscall crnlib::symbol_codec::arith_renorm_enc_interval(symbol_codec *this)

{
  uint uVar1;
  uint uVar2;
  uchar local_19;
  
  uVar1 = this->m_arith_base;
  do {
    local_19 = (uchar)(uVar1 >> 0x18);
    vector<unsigned_char>::push_back(&this->m_arith_output_buf,&local_19);
    this->m_total_bits_written = this->m_total_bits_written + 8;
    uVar1 = this->m_arith_base << 8;
    this->m_arith_base = uVar1;
    uVar2 = this->m_arith_length << 8;
    this->m_arith_length = uVar2;
  } while (uVar2 < 0x1000000);
  return;
}

Assistant:

void symbol_codec::arith_renorm_enc_interval()
    {
        do
        {
            m_arith_output_buf.push_back((m_arith_base >> 24) & 0xFF);
            m_total_bits_written += 8;

            m_arith_base <<= 8;
        } while ((m_arith_length <<= 8) < cSymbolCodecArithMinLen);
    }